

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall ymfm::ym2610::reset(ym2610 *this)

{
  fm_engine_base<ymfm::opn_registers_base<true>_>::reset
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  ssg_engine::reset(&this->m_ssg);
  adpcm_a_engine::reset(&this->m_adpcm_a);
  adpcm_b_engine::reset(&this->m_adpcm_b);
  this->m_eos_status = '\0';
  this->m_flag_mask = 0xbf;
  return;
}

Assistant:

void ym2610::reset()
{
	// reset the engines
	m_fm.reset();
	m_ssg.reset();
	m_adpcm_a.reset();
	m_adpcm_b.reset();

	// initialize our special interrupt states
	m_eos_status = 0x00;
	m_flag_mask = EOS_FLAGS_MASK;
}